

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btMultiBody.cpp
# Opt level: O0

void __thiscall
btMultiBody::calcAccelerationDeltasMultiDof
          (btMultiBody *this,btScalar *force,btScalar *output,btAlignedObjectArray<float> *scratch_r
          ,btAlignedObjectArray<btVector3> *scratch_v)

{
  int colsA;
  int rowsB;
  int iVar1;
  btSpatialMotionVector *pbVar2;
  btVector3 *pbVar3;
  btMultiBody *this_00;
  btSpatialMotionVector *outVec;
  float *pfVar4;
  btMultibodyLink *pbVar5;
  btVector3 *pbVar6;
  btScalar *pbVar7;
  btAlignedObjectArray<float> *in_RCX;
  btScalar *in_RDX;
  btScalar *in_RSI;
  btMultiBody *in_RDI;
  btSpatialTransformationMatrix *in_R8;
  btScalar bVar8;
  btVector3 bVar9;
  btVector3 vdot_out;
  btVector3 omegadot_out;
  int dof_4;
  btScalar *invDi_1;
  btSpatialForceVector *hDof_1;
  int dof_3;
  int parent_1;
  int i_2;
  btScalar *joint_accel;
  btSpatialForceVector *hDof;
  int dof_2;
  int dof2;
  int dof_1;
  btScalar *invDi;
  btVector3 out_bottom;
  btVector3 out_top;
  btVector3 in_bottom;
  btVector3 in_top;
  int dof;
  int parent;
  int i_1;
  int i;
  btScalar *Y;
  btScalar *invD;
  btSpatialMotionVector *spatAcc;
  btSpatialForceVector *h;
  btMatrix3x3 *rot_from_parent;
  btSpatialForceVector *zeroAccSpatFrc;
  btVector3 *v_ptr;
  btScalar *r_ptr;
  int num_links;
  btSpatialForceVector *in_stack_fffffffffffffc78;
  undefined4 uVar10;
  btSpatialTransformationMatrix *in_stack_fffffffffffffc80;
  btSpatialForceVector *in_stack_fffffffffffffc88;
  btSpatialMotionVector *in_stack_fffffffffffffc90;
  btMatrix3x3 *m;
  btScalar *in_stack_fffffffffffffc98;
  btAlignedObjectArray<btVector3> *in_stack_fffffffffffffca0;
  btScalar *in_stack_fffffffffffffca8;
  btSpatialMotionVector *s;
  undefined4 in_stack_fffffffffffffcb0;
  int iVar11;
  undefined4 in_stack_fffffffffffffcb4;
  btScalar *in_stack_fffffffffffffcc0;
  float *pfVar12;
  undefined8 in_stack_fffffffffffffcd8;
  eOutputOperation outOp;
  btSpatialForceVector *in_stack_fffffffffffffce0;
  btSpatialForceVector *pbVar13;
  btSpatialForceVector *in_stack_fffffffffffffce8;
  undefined4 in_stack_fffffffffffffcf0;
  float fVar14;
  undefined4 in_stack_fffffffffffffcf4;
  btSpatialForceVector *local_2a0;
  btSpatialMotionVector *inVec;
  btSpatialTransformationMatrix *this_01;
  btScalar local_238 [2];
  btScalar local_230 [2];
  btVector3 local_228;
  btVector3 local_218 [3];
  btScalar local_1e8 [4];
  btMatrix3x3 local_1d8;
  int local_1a4;
  float *local_1a0;
  btSpatialForceVector *local_198;
  int local_18c;
  int local_188;
  int local_184;
  undefined8 local_180;
  undefined8 local_178;
  undefined8 local_170;
  undefined8 local_168;
  btScalar *local_160;
  eOutputOperation in_stack_fffffffffffffeac;
  btSpatialForceVector *in_stack_fffffffffffffeb0;
  btSpatialForceVector *in_stack_fffffffffffffeb8;
  btSpatialTransformationMatrix *in_stack_fffffffffffffec0;
  int local_12c;
  int local_128;
  int local_124;
  btVector3 local_114;
  btVector3 local_104;
  btVector3 local_f4;
  btVector3 local_e4;
  int local_d4;
  int local_d0;
  int local_cc;
  int local_c8;
  btSpatialForceVector local_c4 [2];
  btSpatialMotionVector *local_80;
  float *local_78;
  btSpatialMotionVector *result;
  btSpatialForceVector *pbVar15;
  btVector3 local_40;
  undefined4 local_30;
  int local_2c;
  btSpatialTransformationMatrix *local_28;
  btAlignedObjectArray<float> *local_20;
  btScalar *local_18;
  btScalar *local_10;
  
  local_28 = in_R8;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_2c = getNumLinks((btMultiBody *)0x23f2b4);
  local_30 = 0;
  btAlignedObjectArray<float>::resize
            ((btAlignedObjectArray<float> *)in_stack_fffffffffffffca0,
             (int)((ulong)in_stack_fffffffffffffc98 >> 0x20),(float *)in_stack_fffffffffffffc90);
  this_01 = local_28;
  btVector3::btVector3(&local_40);
  btAlignedObjectArray<btVector3>::resize
            (in_stack_fffffffffffffca0,(int)((ulong)in_stack_fffffffffffffc98 >> 0x20),
             &in_stack_fffffffffffffc90->m_topVec);
  if (in_RDI->m_dofCount == 0) {
    pbVar2 = (btSpatialMotionVector *)0x0;
  }
  else {
    pbVar2 = (btSpatialMotionVector *)btAlignedObjectArray<float>::operator[](local_20,0);
  }
  inVec = pbVar2;
  pbVar3 = btAlignedObjectArray<btVector3>::operator[]
                     ((btAlignedObjectArray<btVector3> *)local_28,0);
  result = (btSpatialMotionVector *)(pbVar3 + (local_2c * 2 + 2));
  this_00 = (btMultiBody *)btAlignedObjectArray<btMatrix3x3>::operator[](&in_RDI->m_matrixBuf,0);
  if (in_RDI->m_dofCount < 1) {
    outVec = (btSpatialMotionVector *)0x0;
  }
  else {
    outVec = (btSpatialMotionVector *)
             btAlignedObjectArray<btVector3>::operator[](&in_RDI->m_vectorBuf,0);
  }
  pbVar13 = (btSpatialForceVector *)outVec;
  if (in_RDI->m_dofCount < 1) {
    pfVar4 = (float *)0x0;
  }
  else {
    pfVar4 = btAlignedObjectArray<float>::operator[](&in_RDI->m_realBuf,in_RDI->m_dofCount + 6);
  }
  local_80 = pbVar2;
  local_78 = pfVar4;
  if ((calcAccelerationDeltasMultiDof(float_const*,float*,btAlignedObjectArray<float>&,btAlignedObjectArray<btVector3>&)
       ::result == '\0') &&
     (iVar1 = __cxa_guard_acquire(&calcAccelerationDeltasMultiDof(float_const*,float*,btAlignedObjectArray<float>&,btAlignedObjectArray<btVector3>&)
                                   ::result), iVar1 != 0)) {
    btSpatialMotionVector::btSpatialMotionVector((btSpatialMotionVector *)in_stack_fffffffffffffc80)
    ;
    __cxa_guard_release(&calcAccelerationDeltasMultiDof(float_const*,float*,btAlignedObjectArray<float>&,btAlignedObjectArray<btVector3>&)
                         ::result);
  }
  outOp = (eOutputOperation)((ulong)in_stack_fffffffffffffcd8 >> 0x20);
  if (calcAccelerationDeltasMultiDof(float_const*,float*,btAlignedObjectArray<float>&,btAlignedObjectArray<btVector3>&)
      ::spatForceVecTemps == '\0') {
    iVar1 = __cxa_guard_acquire(&calcAccelerationDeltasMultiDof(float_const*,float*,btAlignedObjectArray<float>&,btAlignedObjectArray<btVector3>&)
                                 ::spatForceVecTemps);
    outOp = (eOutputOperation)((ulong)in_stack_fffffffffffffcd8 >> 0x20);
    if (iVar1 != 0) {
      local_2a0 = calcAccelerationDeltasMultiDof::spatForceVecTemps;
      do {
        btSpatialForceVector::btSpatialForceVector
                  ((btSpatialForceVector *)in_stack_fffffffffffffc80);
        outOp = (eOutputOperation)((ulong)in_stack_fffffffffffffcd8 >> 0x20);
        local_2a0 = local_2a0 + 1;
      } while (local_2a0 !=
               (btSpatialForceVector *)
               &calcAccelerationDeltasMultiDof(float_const*,float*,btAlignedObjectArray<float>&,btAlignedObjectArray<btVector3>&)
                ::spatForceVecTemps);
      __cxa_guard_release(&calcAccelerationDeltasMultiDof(float_const*,float*,btAlignedObjectArray<float>&,btAlignedObjectArray<btVector3>&)
                           ::spatForceVecTemps);
    }
  }
  if ((calcAccelerationDeltasMultiDof(float_const*,float*,btAlignedObjectArray<float>&,btAlignedObjectArray<btVector3>&)
       ::fromParent == '\0') &&
     (iVar1 = __cxa_guard_acquire(&calcAccelerationDeltasMultiDof(float_const*,float*,btAlignedObjectArray<float>&,btAlignedObjectArray<btVector3>&)
                                   ::fromParent), iVar1 != 0)) {
    btSpatialTransformationMatrix::btSpatialTransformationMatrix(in_stack_fffffffffffffc80);
    __cxa_guard_release(&calcAccelerationDeltasMultiDof(float_const*,float*,btAlignedObjectArray<float>&,btAlignedObjectArray<btVector3>&)
                         ::fromParent);
  }
  if ((in_RDI->m_fixedBase & 1U) == 0) {
    btMatrix3x3::operator=
              (&calcAccelerationDeltasMultiDof::fromParent.m_rotMat,(btMatrix3x3 *)this_00);
    local_c4[0].m_bottomVec.m_floats[1] = -*local_10;
    local_c4[0].m_bottomVec.m_floats[0] = -local_10[1];
    local_c4[0].m_topVec.m_floats[3] = -local_10[2];
    local_c4[0].m_topVec.m_floats[2] = -local_10[3];
    local_c4[0].m_topVec.m_floats[1] = -local_10[4];
    local_c4[0].m_topVec.m_floats[0] = -local_10[5];
    in_stack_fffffffffffffc78 = local_c4;
    btSpatialForceVector::btSpatialForceVector
              ((btSpatialForceVector *)CONCAT44(in_stack_fffffffffffffcb4,in_stack_fffffffffffffcb0)
               ,in_stack_fffffffffffffca8,(btScalar *)in_stack_fffffffffffffca0,
               in_stack_fffffffffffffc98,(btScalar *)in_stack_fffffffffffffc90,
               (btScalar *)in_stack_fffffffffffffc88,in_stack_fffffffffffffcc0);
    btSpatialTransformationMatrix::transformRotationOnly<btSpatialForceVector>
              ((btSpatialTransformationMatrix *)
               CONCAT44(in_stack_fffffffffffffcf4,in_stack_fffffffffffffcf0),
               in_stack_fffffffffffffce8,in_stack_fffffffffffffce0,outOp);
  }
  else {
    btSpatialForceVector::setZero((btSpatialForceVector *)in_stack_fffffffffffffc80);
  }
  for (local_c8 = 0; local_cc = local_2c, local_c8 < local_2c; local_c8 = local_c8 + 1) {
    btSpatialForceVector::setZero((btSpatialForceVector *)in_stack_fffffffffffffc80);
  }
  while (local_cc = local_cc + -1, -1 < local_cc) {
    pbVar5 = btAlignedObjectArray<btMultibodyLink>::operator[](&in_RDI->m_links,local_cc);
    local_d0 = pbVar5->m_parent;
    btMatrix3x3::operator=
              (&calcAccelerationDeltasMultiDof::fromParent.m_rotMat,
               (btMatrix3x3 *)((&this_00->m_basePos)[(long)(local_cc + 1) * 3 + -2].m_floats + 2));
    pbVar5 = btAlignedObjectArray<btMultibodyLink>::operator[](&in_RDI->m_links,local_cc);
    calcAccelerationDeltasMultiDof::fromParent.m_trnVec.m_floats._0_8_ =
         *(undefined8 *)(pbVar5->m_cachedRVector).m_floats;
    calcAccelerationDeltasMultiDof::fromParent.m_trnVec.m_floats._8_8_ =
         *(undefined8 *)((pbVar5->m_cachedRVector).m_floats + 2);
    for (local_d4 = 0; iVar1 = local_d4,
        pbVar5 = btAlignedObjectArray<btMultibodyLink>::operator[](&in_RDI->m_links,local_cc),
        pbVar7 = local_10, iVar1 < pbVar5->m_dofCount; local_d4 = local_d4 + 1) {
      pbVar5 = btAlignedObjectArray<btMultibodyLink>::operator[](&in_RDI->m_links,local_cc);
      fVar14 = pbVar7[pbVar5->m_dofOffset + 6 + local_d4];
      btAlignedObjectArray<btMultibodyLink>::operator[](&in_RDI->m_links,local_cc);
      bVar8 = btSpatialMotionVector::dot(in_stack_fffffffffffffc90,in_stack_fffffffffffffc88);
      pbVar2 = local_80;
      pbVar5 = btAlignedObjectArray<btMultibodyLink>::operator[](&in_RDI->m_links,local_cc);
      (pbVar2->m_topVec).m_floats[pbVar5->m_dofOffset + local_d4] = fVar14 - bVar8;
    }
    btVector3::btVector3(&local_e4);
    btVector3::btVector3(&local_f4);
    btVector3::btVector3(&local_104);
    btVector3::btVector3(&local_114);
    pfVar12 = local_78;
    pbVar5 = btAlignedObjectArray<btMultibodyLink>::operator[](&in_RDI->m_links,local_cc);
    iVar1 = pbVar5->m_dofOffset;
    pbVar5 = btAlignedObjectArray<btMultibodyLink>::operator[](&in_RDI->m_links,local_cc);
    iVar11 = pbVar5->m_dofOffset;
    for (local_124 = 0;
        pbVar5 = btAlignedObjectArray<btMultibodyLink>::operator[](&in_RDI->m_links,local_cc),
        local_124 < pbVar5->m_dofCount; local_124 = local_124 + 1) {
      calcAccelerationDeltasMultiDof::invD_times_Y[local_124] = 0.0;
      for (local_128 = 0;
          pbVar5 = btAlignedObjectArray<btMultibodyLink>::operator[](&in_RDI->m_links,local_cc),
          local_128 < pbVar5->m_dofCount; local_128 = local_128 + 1) {
        pbVar5 = btAlignedObjectArray<btMultibodyLink>::operator[](&in_RDI->m_links,local_cc);
        pbVar2 = local_80;
        fVar14 = pfVar12[(long)(iVar1 * iVar11) + (long)(local_124 * pbVar5->m_dofCount + local_128)
                        ];
        pbVar5 = btAlignedObjectArray<btMultibodyLink>::operator[](&in_RDI->m_links,local_cc);
        calcAccelerationDeltasMultiDof::invD_times_Y[local_124] =
             fVar14 * (pbVar2->m_topVec).m_floats[pbVar5->m_dofOffset + local_128] +
             calcAccelerationDeltasMultiDof::invD_times_Y[local_124];
      }
    }
    pbVar6 = pbVar3 + (long)(local_cc + 1) * 2;
    calcAccelerationDeltasMultiDof::spatForceVecTemps[0].m_topVec.m_floats._0_8_ =
         *(undefined8 *)pbVar6->m_floats;
    calcAccelerationDeltasMultiDof::spatForceVecTemps[0].m_topVec.m_floats._8_8_ =
         *(undefined8 *)(pbVar6->m_floats + 2);
    calcAccelerationDeltasMultiDof::spatForceVecTemps[0].m_bottomVec.m_floats._0_8_ =
         *(undefined8 *)pbVar6[1].m_floats;
    calcAccelerationDeltasMultiDof::spatForceVecTemps[0].m_bottomVec.m_floats._8_8_ =
         *(undefined8 *)(pbVar6[1].m_floats + 2);
    for (local_12c = 0;
        pbVar5 = btAlignedObjectArray<btMultibodyLink>::operator[](&in_RDI->m_links,local_cc),
        local_12c < pbVar5->m_dofCount; local_12c = local_12c + 1) {
      btAlignedObjectArray<btMultibodyLink>::operator[](&in_RDI->m_links,local_cc);
      btSpatialForceVector::operator*
                ((btSpatialForceVector *)
                 CONCAT44(in_stack_fffffffffffffcb4,in_stack_fffffffffffffcb0),
                 in_stack_fffffffffffffca8);
      btSpatialForceVector::operator+=
                ((btSpatialForceVector *)in_stack_fffffffffffffc80,in_stack_fffffffffffffc78);
    }
    btSpatialTransformationMatrix::transformInverse<btSpatialForceVector>
              (in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0,
               in_stack_fffffffffffffeac);
    btSpatialForceVector::operator+=
              ((btSpatialForceVector *)in_stack_fffffffffffffc80,in_stack_fffffffffffffc78);
  }
  local_160 = local_18 + 6;
  if ((in_RDI->m_fixedBase & 1U) == 0) {
    solveImatrix(this_00,pbVar13,result);
    btSpatialMotionVector::operator-
              ((btSpatialMotionVector *)
               CONCAT44(in_stack_fffffffffffffcb4,in_stack_fffffffffffffcb0));
    *(undefined8 *)(result->m_topVec).m_floats = local_180;
    *(undefined8 *)((result->m_topVec).m_floats + 2) = local_178;
    *(undefined8 *)(result->m_bottomVec).m_floats = local_170;
    *(undefined8 *)((result->m_bottomVec).m_floats + 2) = local_168;
  }
  else {
    btSpatialMotionVector::setZero((btSpatialMotionVector *)in_stack_fffffffffffffc80);
  }
  for (local_184 = 0; local_184 < local_2c; local_184 = local_184 + 1) {
    pbVar5 = btAlignedObjectArray<btMultibodyLink>::operator[](&in_RDI->m_links,local_184);
    local_188 = pbVar5->m_parent;
    btMatrix3x3::operator=
              (&calcAccelerationDeltasMultiDof::fromParent.m_rotMat,
               (btMatrix3x3 *)((&this_00->m_basePos)[(long)(local_184 + 1) * 3 + -2].m_floats + 2));
    pbVar5 = btAlignedObjectArray<btMultibodyLink>::operator[](&in_RDI->m_links,local_184);
    calcAccelerationDeltasMultiDof::fromParent.m_trnVec.m_floats._0_8_ =
         *(undefined8 *)(pbVar5->m_cachedRVector).m_floats;
    calcAccelerationDeltasMultiDof::fromParent.m_trnVec.m_floats._8_8_ =
         *(undefined8 *)((pbVar5->m_cachedRVector).m_floats + 2);
    btSpatialTransformationMatrix::transform<btSpatialMotionVector>
              (this_01,inVec,outVec,(eOutputOperation)((ulong)pfVar4 >> 0x20));
    local_18c = 0;
    while( true ) {
      iVar1 = local_18c;
      pbVar5 = btAlignedObjectArray<btMultibodyLink>::operator[](&in_RDI->m_links,local_184);
      pfVar12 = local_78;
      uVar10 = (undefined4)((ulong)in_stack_fffffffffffffc78 >> 0x20);
      if (pbVar5->m_dofCount <= iVar1) break;
      pbVar15 = pbVar13;
      pbVar5 = btAlignedObjectArray<btMultibodyLink>::operator[](&in_RDI->m_links,local_184);
      local_198 = pbVar13 + (pbVar5->m_dofOffset + local_18c);
      pbVar2 = local_80;
      pbVar5 = btAlignedObjectArray<btMultibodyLink>::operator[](&in_RDI->m_links,local_184);
      fVar14 = (pbVar2->m_topVec).m_floats[pbVar5->m_dofOffset + local_18c];
      bVar8 = btSpatialMotionVector::dot(in_stack_fffffffffffffc90,in_stack_fffffffffffffc88);
      calcAccelerationDeltasMultiDof::Y_minus_hT_a[local_18c] = fVar14 - bVar8;
      local_18c = local_18c + 1;
      in_stack_fffffffffffffce0 = pbVar13;
      pbVar13 = pbVar15;
    }
    pbVar5 = btAlignedObjectArray<btMultibodyLink>::operator[](&in_RDI->m_links,local_184);
    iVar1 = pbVar5->m_dofOffset;
    pbVar5 = btAlignedObjectArray<btMultibodyLink>::operator[](&in_RDI->m_links,local_184);
    pfVar12 = pfVar12 + iVar1 * pbVar5->m_dofOffset;
    local_1a0 = pfVar12;
    pbVar5 = btAlignedObjectArray<btMultibodyLink>::operator[](&in_RDI->m_links,local_184);
    iVar11 = pbVar5->m_dofCount;
    pbVar5 = btAlignedObjectArray<btMultibodyLink>::operator[](&in_RDI->m_links,local_184);
    colsA = pbVar5->m_dofCount;
    pbVar5 = btAlignedObjectArray<btMultibodyLink>::operator[](&in_RDI->m_links,local_184);
    rowsB = pbVar5->m_dofCount;
    pbVar7 = local_160;
    pbVar5 = btAlignedObjectArray<btMultibodyLink>::operator[](&in_RDI->m_links,local_184);
    pbVar2 = (btSpatialMotionVector *)(pbVar7 + pbVar5->m_dofOffset);
    in_stack_fffffffffffffc78 = (btSpatialForceVector *)CONCAT44(uVar10,1);
    mulMatrix(in_RDI,pfVar12,calcAccelerationDeltasMultiDof::Y_minus_hT_a,iVar11,colsA,rowsB,1,
              (btScalar *)pbVar2);
    local_1a4 = 0;
    while (iVar11 = local_1a4,
          pbVar5 = btAlignedObjectArray<btMultibodyLink>::operator[](&in_RDI->m_links,local_184),
          iVar11 < pbVar5->m_dofCount) {
      pbVar5 = btAlignedObjectArray<btMultibodyLink>::operator[](&in_RDI->m_links,local_184);
      s = pbVar5->m_axes + local_1a4;
      btAlignedObjectArray<btMultibodyLink>::operator[](&in_RDI->m_links,local_184);
      btSpatialMotionVector::operator*
                ((btSpatialMotionVector *)CONCAT44(iVar1,iVar11),(btScalar *)s);
      btSpatialMotionVector::operator+=(pbVar2,(btSpatialMotionVector *)in_stack_fffffffffffffc78);
      local_1a4 = local_1a4 + 1;
    }
  }
  m = &local_1d8;
  btVector3::btVector3(m->m_el);
  pbVar3 = local_218;
  btMatrix3x3::transpose((btMatrix3x3 *)in_stack_fffffffffffffce0);
  btSpatialMotionVector::getAngular(result);
  bVar9 = ::operator*(m,pbVar3);
  local_1e8._0_8_ = bVar9.m_floats._0_8_;
  local_1e8._8_8_ = bVar9.m_floats._8_8_;
  local_1d8.m_el[0].m_floats[0] = local_1e8[0];
  local_1d8.m_el[0].m_floats[1] = local_1e8[1];
  local_1d8.m_el[0].m_floats[2] = local_1e8[2];
  local_1d8.m_el[0].m_floats[3] = local_1e8[3];
  local_1e8 = bVar9.m_floats;
  pbVar7 = btVector3::operator_cast_to_float_(m->m_el);
  *local_18 = *pbVar7;
  pbVar7 = btVector3::operator_cast_to_float_(m->m_el);
  local_18[1] = pbVar7[1];
  pbVar7 = btVector3::operator_cast_to_float_(m->m_el);
  local_18[2] = pbVar7[2];
  btVector3::btVector3(&local_228);
  btMatrix3x3::transpose((btMatrix3x3 *)in_stack_fffffffffffffce0);
  btSpatialMotionVector::getLinear(result);
  bVar9 = ::operator*(m,pbVar3);
  local_238 = bVar9.m_floats._0_8_;
  local_228.m_floats[0] = local_238[0];
  local_228.m_floats[1] = local_238[1];
  local_230 = bVar9.m_floats._8_8_;
  local_228.m_floats[2] = local_230[0];
  local_228.m_floats[3] = local_230[1];
  pbVar7 = btVector3::operator_cast_to_float_(&local_228);
  local_18[3] = *pbVar7;
  pbVar7 = btVector3::operator_cast_to_float_(&local_228);
  local_18[4] = pbVar7[1];
  pbVar7 = btVector3::operator_cast_to_float_(&local_228);
  local_18[5] = pbVar7[2];
  return;
}

Assistant:

void btMultiBody::calcAccelerationDeltasMultiDof(const btScalar *force, btScalar *output,
                                       btAlignedObjectArray<btScalar> &scratch_r, btAlignedObjectArray<btVector3> &scratch_v) const
{
    // Temporary matrices/vectors -- use scratch space from caller
    // so that we don't have to keep reallocating every frame

	
	int num_links = getNumLinks();	
    scratch_r.resize(m_dofCount);
    scratch_v.resize(4*num_links + 4);	    

    btScalar * r_ptr = m_dofCount ? &scratch_r[0] : 0;
    btVector3 * v_ptr = &scratch_v[0];

    // zhat_i^A (scratch space)
    btSpatialForceVector * zeroAccSpatFrc = (btSpatialForceVector *)v_ptr;
	v_ptr += num_links * 2 + 2;

    // rot_from_parent (cached from calcAccelerations)
    const btMatrix3x3 * rot_from_parent = &m_matrixBuf[0];

    // hhat (cached), accel (scratch)
    // hhat is NOT stored for the base (but ahat is) 
	const btSpatialForceVector * h = (btSpatialForceVector *)(m_dofCount > 0 ? &m_vectorBuf[0] : 0);
	btSpatialMotionVector * spatAcc = (btSpatialMotionVector *)v_ptr;
	v_ptr += num_links * 2 + 2;

    // Y_i (scratch), invD_i (cached)
    const btScalar * invD = m_dofCount > 0 ? &m_realBuf[6 + m_dofCount] : 0;
	btScalar * Y = r_ptr; 
	////////////////
	//aux variables
	static btScalar invD_times_Y[6];							//D^{-1} * Y [dofxdof x dofx1 = dofx1] <=> D^{-1} * u; better moved to buffers since it is recalced in calcAccelerationDeltasMultiDof; num_dof of btScalar would cover all bodies
	static btSpatialMotionVector result;							//holds results of the SolveImatrix op; it is a spatial motion vector (accel)
	static btScalar Y_minus_hT_a[6];							//Y - h^{T} * a; it's dofx1 for each body so a single 6x1 temp is enough	
	static btSpatialForceVector spatForceVecTemps[6];				//6 temporary spatial force vectors
	static btSpatialTransformationMatrix fromParent;	
	/////////////////

    // First 'upward' loop.
    // Combines CompTreeLinkVelocities and InitTreeLinks from Mirtich.
	
	// Fill in zero_acc
    // -- set to force/torque on the base, zero otherwise
    if (m_fixedBase) 
	{
        zeroAccSpatFrc[0].setZero();
    } else 
	{	
		//test forces
		fromParent.m_rotMat = rot_from_parent[0];
		fromParent.transformRotationOnly(btSpatialForceVector(-force[0],-force[1],-force[2], -force[3],-force[4],-force[5]), zeroAccSpatFrc[0]);
    }
    for (int i = 0; i < num_links; ++i) 
	{
		zeroAccSpatFrc[i+1].setZero();
    }    

	// 'Downward' loop.
    // (part of TreeForwardDynamics in Mirtich.)
    for (int i = num_links - 1; i >= 0; --i)
	{
		const int parent = m_links[i].m_parent;
		fromParent.m_rotMat = rot_from_parent[i+1]; fromParent.m_trnVec = m_links[i].m_cachedRVector;

		for(int dof = 0; dof < m_links[i].m_dofCount; ++dof)
		{
			Y[m_links[i].m_dofOffset + dof] = force[6 + m_links[i].m_dofOffset + dof]
											- m_links[i].m_axes[dof].dot(zeroAccSpatFrc[i+1])
											;
		}

		btVector3 in_top, in_bottom, out_top, out_bottom;
		const btScalar *invDi = &invD[m_links[i].m_dofOffset*m_links[i].m_dofOffset];
		
		for(int dof = 0; dof < m_links[i].m_dofCount; ++dof)
		{
			invD_times_Y[dof] = 0.f;

			for(int dof2 = 0; dof2 < m_links[i].m_dofCount; ++dof2)
			{
				invD_times_Y[dof] += invDi[dof * m_links[i].m_dofCount + dof2] * Y[m_links[i].m_dofOffset + dof2];				
			}	
		}
		
		 // Zp += pXi * (Zi + hi*Yi/Di)
		spatForceVecTemps[0] = zeroAccSpatFrc[i+1];

		for(int dof = 0; dof < m_links[i].m_dofCount; ++dof)
		{
			const btSpatialForceVector &hDof = h[m_links[i].m_dofOffset + dof];
			//
			spatForceVecTemps[0] += hDof * invD_times_Y[dof];		
		}
		

		fromParent.transformInverse(spatForceVecTemps[0], spatForceVecTemps[1]);
			
		zeroAccSpatFrc[parent+1] += spatForceVecTemps[1];
    }
	
	// ptr to the joint accel part of the output
    btScalar * joint_accel = output + 6;


    // Second 'upward' loop
    // (part of TreeForwardDynamics in Mirtich)

    if (m_fixedBase) 
	{
        spatAcc[0].setZero();
    } 
	else 
	{
		solveImatrix(zeroAccSpatFrc[0], result);
		spatAcc[0] = -result;

    }
	
    // now do the loop over the m_links
    for (int i = 0; i < num_links; ++i)
	{
        const int parent = m_links[i].m_parent;
		fromParent.m_rotMat = rot_from_parent[i+1]; fromParent.m_trnVec = m_links[i].m_cachedRVector;

		fromParent.transform(spatAcc[parent+1], spatAcc[i+1]);
		
		for(int dof = 0; dof < m_links[i].m_dofCount; ++dof)
		{
			const btSpatialForceVector &hDof = h[m_links[i].m_dofOffset + dof];
			//			
			Y_minus_hT_a[dof] = Y[m_links[i].m_dofOffset + dof] - spatAcc[i+1].dot(hDof);
		}

		const btScalar *invDi = &invD[m_links[i].m_dofOffset*m_links[i].m_dofOffset];
		mulMatrix(const_cast<btScalar*>(invDi), Y_minus_hT_a, m_links[i].m_dofCount, m_links[i].m_dofCount, m_links[i].m_dofCount, 1, &joint_accel[m_links[i].m_dofOffset]);

		for(int dof = 0; dof < m_links[i].m_dofCount; ++dof)		
			spatAcc[i+1] += m_links[i].m_axes[dof] * joint_accel[m_links[i].m_dofOffset + dof];      
    }

    // transform base accelerations back to the world frame.
    btVector3 omegadot_out;
    omegadot_out = rot_from_parent[0].transpose() * spatAcc[0].getAngular();
	output[0] = omegadot_out[0];
	output[1] = omegadot_out[1];
	output[2] = omegadot_out[2];

    btVector3 vdot_out;
    vdot_out = rot_from_parent[0].transpose() * spatAcc[0].getLinear();
	output[3] = vdot_out[0];
	output[4] = vdot_out[1];
	output[5] = vdot_out[2];

	/////////////////
	//printf("delta = [");
	//for(int dof = 0; dof < getNumDofs() + 6; ++dof)
	//	printf("%.2f ", output[dof]);
	//printf("]\n");
	/////////////////
}